

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O2

void __thiscall
deqp::gls::LongStressCaseInternal::DebugInfoRenderer::drawInfo
          (DebugInfoRenderer *this,deUint64 secondsElapsed,int texMem,int maxTexMem,int bufMem,
          int maxBufMem,int iterNdx)

{
  undefined1 *puVar1;
  ostream *poVar2;
  allocator<char> local_1d9;
  string local_1d8;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  ostringstream text;
  
  local_1b8 = maxBufMem;
  local_1b4 = bufMem;
  local_1b0 = maxTexMem;
  local_1ac = texMem;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&text);
  *(undefined8 *)
   (&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10 +
   (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) = 2;
  poVar2 = std::operator<<((ostringstream *)&text,0x30);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,":");
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
  poVar2 = std::operator<<(poVar2,0x30);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,":");
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
  poVar2 = std::operator<<(poVar2,0x30);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2,":");
  *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
  poVar2 = std::operator<<(poVar2,0x30);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  puVar1 = &text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,0);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,glcts::fixed_sample_locations_values + 1,&local_1d9);
  std::__cxx11::stringbuf::str((string *)puVar1);
  std::__cxx11::string::~string((string *)&local_1d8);
  *(uint *)(&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 +
           (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) =
       *(uint *)(&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 +
                (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]) & 0xfffffefb | 4;
  *(undefined8 *)
   (&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
   (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) = 2;
  poVar2 = (ostream *)std::ostream::operator<<(&text,(float)local_1ac * 9.536743e-07);
  poVar2 = std::operator<<(poVar2,"/");
  std::ostream::operator<<(poVar2,(float)local_1b0 * 9.536743e-07);
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,1);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,glcts::fixed_sample_locations_values + 1,&local_1d9);
  std::__cxx11::stringbuf::str((string *)puVar1);
  std::__cxx11::string::~string((string *)&local_1d8);
  *(uint *)(&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 +
           (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) =
       *(uint *)(&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18 +
                (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                      [-3]) & 0xfffffefb | 4;
  *(undefined8 *)
   (&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8 +
   (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) = 2;
  poVar2 = (ostream *)std::ostream::operator<<(&text,(float)local_1b4 * 9.536743e-07);
  poVar2 = std::operator<<(poVar2,"/");
  std::ostream::operator<<(poVar2,(float)local_1b8 * 9.536743e-07);
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,2);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,glcts::fixed_sample_locations_values + 1,&local_1d9);
  std::__cxx11::stringbuf::str((string *)puVar1);
  std::__cxx11::string::~string((string *)&local_1d8);
  *(undefined8 *)
   (&text.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10 +
   (long)text.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]) = 0;
  std::ostream::operator<<(&text,iterNdx);
  std::__cxx11::stringbuf::str();
  addTextToBuffer(this,&local_1d8,3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&text);
  render(this);
  return;
}

Assistant:

void DebugInfoRenderer::drawInfo (const deUint64 secondsElapsed, const int texMem, const int maxTexMem, const int bufMem, const int maxBufMem, const int iterNdx)
{
	const deUint64 m = secondsElapsed / 60;
	const deUint64 h = m / 60;
	const deUint64 d = h / 24;

	{
		std::ostringstream text;

		text << std::setw(2) << std::setfill('0') << d << ":"
			 << std::setw(2) << std::setfill('0') << h % 24 << ":"
			 << std::setw(2) << std::setfill('0') << m % 60 << ":"
			 << std::setw(2) << std::setfill('0') << secondsElapsed % 60;
		addTextToBuffer(text.str(), 0);
		text.str("");

		text << std::fixed << std::setprecision(2) << (float)texMem/Mi << "/" << (float)maxTexMem/Mi;
		addTextToBuffer(text.str(), 1);
		text.str("");

		text << std::fixed << std::setprecision(2) << (float)bufMem/Mi << "/" << (float)maxBufMem/Mi;
		addTextToBuffer(text.str(), 2);
		text.str("");

		text << std::setw(0) << iterNdx;
		addTextToBuffer(text.str(), 3);
	}

	render();
}